

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbyte.hpp
# Opt level: O2

uint32_t read_vbyte(FILE *f)

{
  uint uVar1;
  size_t sVar2;
  uint32_t uVar3;
  uint uVar4;
  uint8_t chr;
  
  uVar3 = 0;
  chr = '\0';
  uVar4 = 0;
  do {
    sVar2 = fread(&chr,1,1,(FILE *)f);
    if ((int)sVar2 != 1) {
      quit("reading vbyte from file: %d != %d",sVar2 & 0xffffffff,1);
    }
    uVar1 = uVar4 & 0x1f;
    uVar4 = uVar4 + 7;
    uVar3 = uVar3 + ((chr & 0x7f) << uVar1);
  } while ((char)chr < '\0');
  return uVar3;
}

Assistant:

uint32_t read_vbyte(FILE* f)
{
    uint32_t x = 0;
    unsigned int shift = 0;
    uint8_t chr = 0;
    while (true) {
        int ret = fread(&chr, 1, 1, f);
        if (ret != 1) {
            quit("reading vbyte from file: %d != %d", ret, 1);
        }
        x += ((chr & 127) << shift);
        if (!(chr & 128)) {
            return x;
        }
        shift += 7;
    }
}